

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O3

void Abc_SclLibNormalizeSurface(SC_Surface *p,float Time,float Load)

{
  float *pfVar1;
  void **ppvVar2;
  void *pvVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  
  lVar5 = (long)(p->vIndex0).nSize;
  if (0 < lVar5) {
    pfVar1 = (p->vIndex0).pArray;
    lVar6 = 0;
    do {
      pfVar1[lVar6] = pfVar1[lVar6] * Time;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  lVar5 = (long)(p->vIndex1).nSize;
  if (0 < lVar5) {
    pfVar1 = (p->vIndex1).pArray;
    lVar6 = 0;
    do {
      pfVar1[lVar6] = pfVar1[lVar6] * Load;
      lVar6 = lVar6 + 1;
    } while (lVar5 != lVar6);
  }
  lVar5 = (long)(p->vData).nSize;
  if (0 < lVar5) {
    ppvVar2 = (p->vData).pArray;
    lVar6 = 0;
    do {
      pvVar3 = ppvVar2[lVar6];
      lVar7 = (long)*(int *)((long)pvVar3 + 4);
      if (0 < lVar7) {
        lVar4 = *(long *)((long)pvVar3 + 8);
        lVar8 = 0;
        do {
          *(float *)(lVar4 + lVar8 * 4) = *(float *)(lVar4 + lVar8 * 4) * Time;
          lVar8 = lVar8 + 1;
        } while (lVar7 != lVar8);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar5);
  }
  return;
}

Assistant:

void Abc_SclLibNormalizeSurface( SC_Surface * p, float Time, float Load )
{
    Vec_Flt_t * vArray;
    int i, k; float Entry;
    Vec_FltForEachEntry( &p->vIndex0, Entry, i ) // slew
        Vec_FltWriteEntry( &p->vIndex0, i, Time * Entry );
    Vec_FltForEachEntry( &p->vIndex1, Entry, i ) // load
        Vec_FltWriteEntry( &p->vIndex1, i, Load * Entry );
    Vec_PtrForEachEntry( Vec_Flt_t *, &p->vData, vArray, k )
        Vec_FltForEachEntry( vArray, Entry, i ) // delay/slew
            Vec_FltWriteEntry( vArray, i, Time * Entry );
}